

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<DefaultFormatter>::
Ser<ParamsStream<AutoFile&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
          (VectorFormatter<DefaultFormatter> *this,ParamsStream<AutoFile_&,_TransactionSerParams> *s
          ,vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *v)

{
  long lVar1;
  pointer psVar2;
  value_type *elem;
  pointer p;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<ParamsStream<AutoFile&,TransactionSerParams>>
            (s,(long)(v->
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(v->
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4);
  psVar2 = (v->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (p = (v->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start; p != psVar2; p = p + 1) {
    Serialize<ParamsStream<AutoFile&,TransactionSerParams>,CTransaction>(s,p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }